

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_bucket.cpp
# Opt level: O0

timestamp_t
duckdb::TimeBucket::WidthConvertibleToMicrosBinaryOperator::
Operation<duckdb::interval_t,duckdb::timestamp_t,duckdb::timestamp_t>
          (interval_t bucket_width,timestamp_t ts)

{
  bool bVar1;
  timestamp_t bucket_width_micros_00;
  timestamp_t in_RDX;
  timestamp_t in_RDI;
  int64_t ts_micros;
  int64_t bucket_width_micros;
  int64_t in_stack_ffffffffffffffa8;
  int64_t local_8;
  
  bVar1 = duckdb::Value::IsFinite<duckdb::timestamp_t>(in_RDX);
  if (bVar1) {
    duckdb::Interval::GetMicro((interval_t *)&stack0xffffffffffffffe8);
    bucket_width_micros_00 = Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(in_RDI);
    duckdb::Timestamp::GetEpochMicroSeconds(bucket_width_micros_00);
    WidthConvertibleToMicrosCommon
              (bucket_width_micros_00.value,in_RDX.value,in_stack_ffffffffffffffa8);
    local_8 = (int64_t)Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(in_RDI);
  }
  else {
    local_8 = (int64_t)Cast::Operation<duckdb::timestamp_t,duckdb::timestamp_t>(in_RDI);
  }
  return (timestamp_t)local_8;
}

Assistant:

static inline TR Operation(TA bucket_width, TB ts) {
			if (!Value::IsFinite(ts)) {
				return Cast::template Operation<TB, TR>(ts);
			}
			int64_t bucket_width_micros = Interval::GetMicro(bucket_width);
			int64_t ts_micros = Timestamp::GetEpochMicroSeconds(Cast::template Operation<TB, timestamp_t>(ts));
			return Cast::template Operation<timestamp_t, TR>(
			    WidthConvertibleToMicrosCommon(bucket_width_micros, ts_micros, DEFAULT_ORIGIN_MICROS));
		}